

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O0

wstring * ON_UTF16_to_std_wstring_abi_cxx11_
                    (wstring *__return_storage_ptr__,int bTestByteOrder,ON__UINT16 *sUTF16,
                    int sUTF16_count,uint *error_status,uint error_mask,ON__UINT32 error_code_point,
                    ON__UINT16 **sNextUTF16)

{
  int local_890;
  int local_88c;
  int local_888;
  exception *anon_var_0;
  int out_count;
  int in_count;
  int rc;
  ON__UINT16 *sNextIn;
  uint es;
  int buffer_count;
  wchar_t buffer [512];
  uint error_mask_local;
  uint *error_status_local;
  ON__UINT16 *pOStack_20;
  int sUTF16_count_local;
  ON__UINT16 *sUTF16_local;
  int bTestByteOrder_local;
  wstring *str;
  
  buffer[0x1fe]._3_1_ = 0;
  buffer[0x1ff] = error_mask;
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  sNextIn._4_4_ = 0x200;
  error_status_local._4_4_ = sUTF16_count;
  if ((sUTF16_count == -1) && (sUTF16 != (ON__UINT16 *)0x0)) {
    for (error_status_local._4_4_ = 0; sUTF16[error_status_local._4_4_] != 0;
        error_status_local._4_4_ = error_status_local._4_4_ + 1) {
    }
  }
  buffer[0x1fd] = L'\0';
  pOStack_20 = sUTF16;
  sUTF16_local._4_4_ = bTestByteOrder;
  if (error_status != (uint *)0x0) {
    *error_status = 0;
  }
  while( true ) {
    sNextIn._0_4_ = 0;
    _in_count = (ON__UINT16 *)0x0;
    local_890 = ON_ConvertUTF16ToWideChar
                          (sUTF16_local._4_4_,pOStack_20,error_status_local._4_4_,(wchar_t *)&es,
                           0x1ff,(uint *)&sNextIn,buffer[0x1ff],error_code_point,
                           (ON__UINT16 **)&in_count);
    if ((local_890 < 0) || (local_888 = local_890, 0x1ff < local_890)) {
      local_888 = 0;
    }
    (&es)[local_888] = 0;
    if (((_in_count == (ON__UINT16 *)0x0) || (pOStack_20 == (ON__UINT16 *)0x0)) ||
       (_in_count <= pOStack_20)) {
      local_88c = 0;
    }
    else {
      local_88c = (int)((long)_in_count - (long)pOStack_20 >> 1);
    }
    if (((local_88c < 1) || (local_890 < 1)) || (0x1ff < local_890)) {
      local_890 = 0;
    }
    if (0 < local_890) {
      std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__,(ulong)&es);
    }
    pOStack_20 = pOStack_20 + local_88c;
    error_status_local._4_4_ = error_status_local._4_4_ - local_88c;
    if (((((uint)sNextIn & 2) != 0) && (0 < local_88c)) && (0 < local_890)) {
      sNextIn._0_4_ = (uint)sNextIn & 0xfffffffd;
    }
    if (error_status != (uint *)0x0) {
      *error_status = (uint)sNextIn | *error_status;
    }
    if ((((error_status_local._4_4_ < 1) || (local_88c < 1)) || (local_890 < 1)) ||
       (((uint)sNextIn & 3) != 0)) break;
    sUTF16_local._4_4_ = 0;
  }
  if (sNextUTF16 != (ON__UINT16 **)0x0) {
    *sNextUTF16 = pOStack_20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring ON_UTF16_to_std_wstring(
  int bTestByteOrder,
  const ON__UINT16* sUTF16,
  int sUTF16_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  const ON__UINT16** sNextUTF16
  ) ON_NOEXCEPT
{
  std::wstring str;
  wchar_t buffer[512];
  const int buffer_count = static_cast<int>(sizeof(buffer)/sizeof(buffer[0]));
  unsigned int es;
  const ON__UINT16* sNextIn;

  if ( -1 == sUTF16_count && 0 != sUTF16 )
  {
    for ( sUTF16_count = 0; 0 != sUTF16[sUTF16_count]; sUTF16_count++)
    {
      // empty for body
    }
  }

  buffer[buffer_count-1] = 0;

  if ( 0 != error_status )
    *error_status = 0;

  for(;;)
  {
    es = 0;
    sNextIn = 0;
    int rc = ON_ConvertUTF16ToWideChar(
      bTestByteOrder, sUTF16, sUTF16_count,
      buffer, buffer_count-1,
      &es, error_mask, error_code_point,
      &sNextIn
      );

    // insure buffer[] is null terminated.
    buffer[( rc >= 0 && rc < buffer_count) ? rc : 0] = 0;

    // in_count = number of input sUTF16[] elements that were processed
    int in_count = ( 0 != sNextIn && 0 != sUTF16 && sNextIn > sUTF16 )
      ? static_cast<int>(sNextIn - sUTF16)
      : 0;

    // out_count = number of UTF-8 output values
    int out_count = ( in_count > 0 && rc > 0 && rc < buffer_count) ? rc : 0;

    if ( out_count > 0 )
    {
      try {
        str.append(buffer,out_count);
      } catch (const std::exception& ) {
        es |= 2;
        in_count = 0;
        out_count = 0;
      }
    }

    sUTF16 += in_count;
    sUTF16_count -= in_count;

    if ( 0 != (0x02 & es) && in_count > 0 && out_count > 0 )
    {
      // buffer[] was not long enough and we made progress.
      // Clear bit 2 and allow further processing
      es &= 0xFFFFFFFD;
    }

    if ( 0 != error_status )
      *error_status |= es;

    if ( sUTF16_count > 0 && in_count > 0 && out_count > 0 && 0 == (es & 3) )
    {
      // There were no blocking errors, we made progress, and there is more input
      bTestByteOrder = false;
      continue;
    }

    break; // finished
  }

  if ( sNextUTF16 )
    *sNextUTF16 = sUTF16;

  // On modern compilers, this return will use an efficient rvalue reference.
  return str;
}